

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O3

void __thiscall
es::init::details_static_instances_counting::InstancesCounterZeroActivated<es::init::ActionOnZero>::
~InstancesCounterZeroActivated(InstancesCounterZeroActivated<es::init::ActionOnZero> *this)

{
  ostream *poVar1;
  ActionOnZero local_9;
  
  LOCK();
  global_static_instances_counter = global_static_instances_counter + -1;
  UNLOCK();
  if (global_static_instances_counter == 0) {
    ActionOnZero::operator()(&local_9);
  }
  else if (global_static_instances_counter < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: negative static counter:",0x1f);
    poVar1 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

[[using gnu: hot]] static T& optimized_get_instance() { return _u._instance; }